

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

uint __thiscall trompeloeil::sequence_handler<1UL>::order(sequence_handler<1UL> *this)

{
  uint uVar1;
  const_iterator pvVar2;
  uint cost;
  value_type *m;
  const_iterator __end0;
  const_iterator __begin0;
  conditional_t<1UL____0,_std::vector<sequence_matcher>,_std::array<sequence_matcher,_1UL>_>
  *__range2;
  uint highest_order;
  sequence_handler<1UL> *this_local;
  
  __range2._4_4_ = 0;
  __end0 = std::array<trompeloeil::sequence_matcher,_1UL>::begin(&this->matchers);
  pvVar2 = std::array<trompeloeil::sequence_matcher,_1UL>::end(&this->matchers);
  for (; __end0 != pvVar2; __end0 = __end0 + 1) {
    uVar1 = sequence_matcher::cost(__end0);
    if (__range2._4_4_ < uVar1) {
      __range2._4_4_ = uVar1;
    }
  }
  return __range2._4_4_;
}

Assistant:

unsigned
    order()
    const
    noexcept
    override
    {
      unsigned highest_order = 0U;
      for (auto& m : matchers)
      {
        auto cost = m.cost();
        if (cost > highest_order)
        {
          highest_order = cost;
        }
      }
      return highest_order;
    }